

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_timecondition(Curl_easy *data,dynbuf *req)

{
  char *thisheader;
  byte bVar1;
  CURLcode CVar2;
  char *pcVar3;
  int iVar4;
  tm keeptime;
  char datestr [80];
  
  CVar2 = CURLE_OK;
  if ((data->set).timecondition != '\0') {
    CVar2 = Curl_gmtime((data->set).timevalue,&keeptime);
    if (CVar2 == CURLE_OK) {
      bVar1 = (data->set).timecondition - 1;
      CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
      if (bVar1 < 3) {
        thisheader = (&PTR_anon_var_dwarf_b45d5_00195510)[bVar1];
        pcVar3 = Curl_checkheaders(data,thisheader,*(size_t *)(&DAT_001766a0 + (ulong)bVar1 * 8));
        CVar2 = CURLE_OK;
        if (pcVar3 == (char *)0x0) {
          iVar4 = 6;
          if (keeptime.tm_wday != 0) {
            iVar4 = keeptime.tm_wday + -1;
          }
          curl_msnprintf(datestr,0x50,"%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",thisheader,
                         Curl_wkday[iVar4],(ulong)(uint)keeptime.tm_mday,Curl_month[keeptime.tm_mon]
                         ,(ulong)(keeptime.tm_year + 0x76c),(ulong)(uint)keeptime.tm_hour,
                         (ulong)(uint)keeptime.tm_min,(ulong)(uint)keeptime.tm_sec);
          CVar2 = Curl_dyn_add(req,datestr);
        }
      }
    }
    else {
      Curl_failf(data,"Invalid TIMEVALUE");
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_timecondition(struct Curl_easy *data,
#ifndef USE_HYPER
                                struct dynbuf *req
#else
                                void *req
#endif
  )
{
  const struct tm *tm;
  struct tm keeptime;
  CURLcode result;
  char datestr[80];
  const char *condp;
  size_t len;

  if(data->set.timecondition == CURL_TIMECOND_NONE)
    /* no condition was asked for */
    return CURLE_OK;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  switch(data->set.timecondition) {
  default:
    DEBUGF(infof(data, "invalid time condition"));
    return CURLE_BAD_FUNCTION_ARGUMENT;

  case CURL_TIMECOND_IFMODSINCE:
    condp = "If-Modified-Since";
    len = 17;
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    condp = "If-Unmodified-Since";
    len = 19;
    break;
  case CURL_TIMECOND_LASTMOD:
    condp = "Last-Modified";
    len = 13;
    break;
  }

  if(Curl_checkheaders(data, condp, len)) {
    /* A custom header was specified; it will be sent instead. */
    return CURLE_OK;
  }

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  msnprintf(datestr, sizeof(datestr),
            "%s: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
            condp,
            Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
            tm->tm_mday,
            Curl_month[tm->tm_mon],
            tm->tm_year + 1900,
            tm->tm_hour,
            tm->tm_min,
            tm->tm_sec);

#ifndef USE_HYPER
  result = Curl_dyn_add(req, datestr);
#else
  result = Curl_hyper_header(data, req, datestr);
#endif

  return result;
}